

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfiledialog.cpp
# Opt level: O0

void __thiscall QFileDialog::selectMimeTypeFilter(QFileDialog *this,QString *filter)

{
  long lVar1;
  bool bVar2;
  QFileDialogOptions *pQVar3;
  QFileDialogPrivate *in_RDI;
  long in_FS_OFFSET;
  QFileDialogPrivate *d;
  QString filterForMime;
  QString *in_stack_ffffffffffffff98;
  undefined6 in_stack_ffffffffffffffa0;
  undefined1 in_stack_ffffffffffffffa6;
  undefined1 in_stack_ffffffffffffffa7;
  byte bVar4;
  QString *filter_00;
  QFileDialog *this_00;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  d_func((QFileDialog *)0x757c2f);
  pQVar3 = QSharedPointer<QFileDialogOptions>::operator->
                     ((QSharedPointer<QFileDialogOptions> *)0x757c45);
  QFileDialogOptions::setInitiallySelectedMimeTypeFilter((QString *)pQVar3);
  filter_00 = (QString *)&DAT_aaaaaaaaaaaaaaaa;
  this_00 = (QFileDialog *)&DAT_aaaaaaaaaaaaaaaa;
  nameFilterForMime((QString *)in_RDI);
  bVar2 = QFileDialogPrivate::usingWidgets
                    ((QFileDialogPrivate *)
                     CONCAT17(in_stack_ffffffffffffffa7,
                              CONCAT16(in_stack_ffffffffffffffa6,in_stack_ffffffffffffffa0)));
  if (bVar2) {
    bVar2 = QString::isEmpty((QString *)0x757d11);
    if (!bVar2) {
      selectNameFilter(this_00,filter_00);
    }
  }
  else {
    QFileDialogPrivate::selectMimeTypeFilter_sys
              ((QFileDialogPrivate *)
               CONCAT17(in_stack_ffffffffffffffa7,
                        CONCAT16(in_stack_ffffffffffffffa6,in_stack_ffffffffffffffa0)),
               in_stack_ffffffffffffff98);
    QFileDialogPrivate::selectedMimeTypeFilter_sys(in_RDI);
    bVar2 = QString::isEmpty((QString *)0x757cbb);
    bVar4 = 0;
    if (bVar2) {
      bVar2 = QString::isEmpty((QString *)0x757cd4);
      bVar4 = bVar2 ^ 0xff;
    }
    QString::~QString((QString *)0x757cec);
    if ((bVar4 & 1) != 0) {
      selectNameFilter(this_00,filter_00);
    }
  }
  QString::~QString((QString *)0x757d30);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QFileDialog::selectMimeTypeFilter(const QString &filter)
{
    Q_D(QFileDialog);
    d->options->setInitiallySelectedMimeTypeFilter(filter);

    const QString filterForMime = nameFilterForMime(filter);

    if (!d->usingWidgets()) {
        d->selectMimeTypeFilter_sys(filter);
        if (d->selectedMimeTypeFilter_sys().isEmpty() && !filterForMime.isEmpty()) {
            selectNameFilter(filterForMime);
        }
    } else if (!filterForMime.isEmpty()) {
        selectNameFilter(filterForMime);
    }
}